

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O3

void m2v_permute_rows(m2v *M,int *rowperm)

{
  uint uVar1;
  m2v_base *pmVar2;
  size_t __n;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  void *pvVar6;
  void *__dest;
  long lVar7;
  ulong uVar8;
  int iVar9;
  void *__s;
  undefined8 uStack_50;
  ulong local_48;
  size_t local_40;
  void *local_38;
  ulong uVar10;
  
  uVar1 = M->n_row;
  lVar7 = -((ulong)uVar1 + 0xf & 0xfffffffffffffff0);
  __s = (void *)((long)&local_48 + lVar7);
  if (0 < (int)uVar1) {
    uVar8 = 0;
    *(undefined8 *)((long)&uStack_50 + lVar7) = 0x1019f6;
    memset(__s,0,(ulong)uVar1);
    uVar1 = M->n_col;
    local_48 = (ulong)uVar1;
    iVar3 = uVar1 + 0x3e;
    if (-1 < (int)(uVar1 + 0x1f)) {
      iVar3 = uVar1 + 0x1f;
    }
    uVar4 = (ulong)(uint)(iVar3 >> 5);
    pvVar6 = (void *)((long)__s - (uVar4 * 4 + 0xf & 0xfffffffffffffff0));
    local_40 = (uVar4 + (uVar4 == 0)) * 4;
    local_38 = pvVar6;
    __dest = pvVar6;
    do {
      __n = local_40;
      if (*(char *)((long)__s + uVar8) == '\0') {
        uVar1 = rowperm[uVar8];
        if (uVar8 == uVar1) {
          *(undefined1 *)((long)__s + uVar8) = 1;
        }
        else {
          if (0 < (int)local_48) {
            iVar3 = M->row_stride;
            pmVar2 = M->e;
            *(undefined8 *)((long)pvVar6 + -8) = 0x101a75;
            memcpy(__dest,pmVar2 + (long)(int)uVar8 * (long)iVar3,__n);
            __dest = local_38;
          }
          uVar5 = (ulong)(uint)M->row_stride;
          uVar4 = uVar8 & 0xffffffff;
          uVar10 = (ulong)uVar1;
          do {
            iVar9 = (int)uVar10;
            *(undefined1 *)((long)__s + (long)iVar9) = 1;
            iVar3 = (int)uVar5;
            if (0 < iVar3) {
              pmVar2 = M->e;
              lVar7 = 0;
              do {
                pmVar2[(int)uVar4 * iVar3 + lVar7] = pmVar2[iVar3 * iVar9 + lVar7];
                lVar7 = lVar7 + 1;
                uVar5 = (ulong)M->row_stride;
              } while (lVar7 < (long)uVar5);
            }
            uVar4 = uVar10;
            uVar10 = (ulong)(uint)rowperm[iVar9];
          } while (uVar8 != (uint)rowperm[iVar9]);
          *(undefined1 *)((long)__s + uVar8) = 1;
          if (0 < (int)uVar5) {
            pmVar2 = M->e;
            lVar7 = 0;
            do {
              pmVar2[(int)uVar5 * iVar9 + lVar7] = *(m2v_base *)((long)__dest + lVar7 * 4);
              lVar7 = lVar7 + 1;
            } while (lVar7 < M->row_stride);
          }
        }
      }
      uVar8 = uVar8 + 1;
    } while ((long)uVar8 < (long)M->n_row);
  }
  return;
}

Assistant:

void MV_GEN_N(_permute_rows)(MV_GEN_TYPE* M, const int* rowperm)
{
	char visited[M->n_row];
	for (int i = 0; i < M->n_row; ++i)
		visited[i] = 0;

	MV_GEN_N(_Def)(rowbuf_mat, rowbuf, 1, M->n_col)
	for (int i = 0; i < M->n_row; ++i) {
		if (visited[i])
			continue;
		if (rowperm[i] == i) {
			/* Simple case of a self-cycle; do nothing. */
			visited[i] = 1;
			continue;
		}

		/* Otherwise we need to shuffle things around. */
		MV_GEN_N(_copy_row)(M, i, &rowbuf_mat, 0);
		int e = i, e_next = rowperm[i];
		while (e_next != i) {
			assert(!visited[e_next]);
			visited[e_next] = 1;
			MV_GEN_N(_copy_row)(M, e_next, M, e);

			/* Advance in the cycle */
			e = e_next;
			e_next = rowperm[e_next];
		}
		visited[i] = 1;
		MV_GEN_N(_copy_row)(&rowbuf_mat, 0, M, e);
	}
}